

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

bool __thiscall MeCab::anon_unknown_0::LatticeImpl::is_available(LatticeImpl *this)

{
  bool bVar1;
  long in_RDI;
  vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_> *unaff_retaddr;
  undefined1 local_9;
  
  local_9 = 0;
  if (*(long *)(in_RDI + 8) != 0) {
    bVar1 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::empty(unaff_retaddr);
    local_9 = 0;
    if (!bVar1) {
      bVar1 = std::vector<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::empty(unaff_retaddr);
      local_9 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool is_available() const {
    return (sentence_ &&
            !begin_nodes_.empty() &&
            !end_nodes_.empty());
  }